

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O2

holder<std::_Ios_Seekdir> * __thiscall
cs::allocator_type<cs_impl::any::holder<std::_Ios_Seekdir>,64ul,cs_impl::default_allocator_provider>
::alloc<std::_Ios_Seekdir_const&>
          (allocator_type<cs_impl::any::holder<std::_Ios_Seekdir>,64ul,cs_impl::default_allocator_provider>
           *this,_Ios_Seekdir *args)

{
  long lVar1;
  holder<std::_Ios_Seekdir> *phVar2;
  
  if ((*(long *)(this + 0x208) == 0) || (global_thread_counter != 0)) {
    phVar2 = (holder<std::_Ios_Seekdir> *)operator_new(0x10);
  }
  else {
    lVar1 = *(long *)(this + 0x208);
    *(long *)(this + 0x208) = lVar1 + -1;
    phVar2 = *(holder<std::_Ios_Seekdir> **)(this + lVar1 * 8 + -8);
  }
  (phVar2->super_baseHolder)._vptr_baseHolder = (_func_int **)&PTR__baseHolder_003702b8;
  phVar2->mDat = *args;
  return phVar2;
}

Assistant:

inline T *alloc(ArgsT &&...args)
		{
			T *ptr = nullptr;
			if (mOffset > 0 && global_thread_counter == 0)
				ptr = mPool[--mOffset];
			else
				ptr = mAlloc.allocate(1);
			mAlloc.construct(ptr, std::forward<ArgsT>(args)...);
			return ptr;
		}